

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestStatFailureAbortsBuild::Run(BuildTestStatFailureAbortsBuild *this)

{
  FileMap *this_00;
  int iVar1;
  Test *pTVar2;
  bool condition;
  mapped_type *pmVar3;
  Node *pNVar4;
  allocator<char> local_82;
  allocator<char> local_81;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string kTooLongToStat;
  
  kTooLongToStat._M_dataplus._M_p = (pointer)&kTooLongToStat.field_2;
  std::__cxx11::string::_M_construct((ulong)&kTooLongToStat,-0x70);
  iVar1 = g_current_test->assertion_failures_;
  std::operator+(&local_60,"build ",&kTooLongToStat);
  std::operator+(&err,&local_60,": cat in\n");
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,err._M_dataplus._M_p,
              (ManifestParserOptions)0x0);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&local_60);
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"in",&local_81);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_82);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&err,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&err);
    this_00 = &(this->super_BuildTest).fs_.files_;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
             ::operator[](this_00,&kTooLongToStat);
    pmVar3->mtime = -1;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
             ::operator[](this_00,&kTooLongToStat);
    std::__cxx11::string::assign((char *)&pmVar3->stat_error);
    pTVar2 = g_current_test;
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    pNVar4 = Builder::AddTarget(&(this->super_BuildTest).builder_,&kTooLongToStat,&err);
    testing::Test::Check
              (pTVar2,pNVar4 == (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x6f2,"builder_.AddTarget(kTooLongToStat, &err)");
    pTVar2 = g_current_test;
    condition = std::operator==("stat failed",&err);
    testing::Test::Check
              (pTVar2,condition,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x6f3,"\"stat failed\" == err");
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&kTooLongToStat);
  return;
}

Assistant:

TEST_F(BuildTest, StatFailureAbortsBuild) {
  const string kTooLongToStat(400, 'i');
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
("build " + kTooLongToStat + ": cat in\n").c_str()));
  fs_.Create("in", "");

  // This simulates a stat failure:
  fs_.files_[kTooLongToStat].mtime = -1;
  fs_.files_[kTooLongToStat].stat_error = "stat failed";

  string err;
  EXPECT_FALSE(builder_.AddTarget(kTooLongToStat, &err));
  EXPECT_EQ("stat failed", err);
}